

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O2

void putbuffer(void *data,int size)

{
  int iVar1;
  int iVar2;
  size_t __n;
  char *stptr;
  long lVar3;
  long lVar4;
  
  iVar2 = loccnt;
  iVar1 = bank;
  if (size != 0) {
    lVar4 = (long)bank;
    lVar3 = (long)loccnt;
    if (lVar4 < 0xf0) {
      if (rom_limit < bank * 0x2000 + size + loccnt) {
        stptr = "ROM overflow!";
        goto LAB_0010f6da;
      }
      if (pass == 1) {
        __n = (size_t)size;
        if (data == (void *)0x0) {
          memset(rom[lVar4] + lVar3,0,__n);
        }
        else {
          memcpy(rom[lVar4] + lVar3,data,__n);
        }
        memset(map[lVar4] + lVar3,page * 0x20 + section,__n);
      }
    }
    else if (0x1fff < loccnt + size) {
      stptr = "PROC overflow!";
LAB_0010f6da:
      fatal_error(stptr);
      return;
    }
    bank = (iVar2 + size >> 0xd) + iVar1;
    loccnt = iVar2 + size & 0x1fff;
    if (((bank < 0xf0) && (max_bank < bank)) && (max_bank = bank, loccnt == 0)) {
      max_bank = bank + -1;
    }
  }
  return;
}

Assistant:

void
putbuffer(void *data, int size)
{
	int addr;

	/* check size */
	if (size == 0)
		return;

	/* check if the buffer will fit in the rom */
	if (bank >= RESERVED_BANK) {
		addr  = loccnt + size;

		if (addr > 0x1FFF) {
			fatal_error("PROC overflow!");
			return;
		}
	}
	else {
		addr  = loccnt + size + (bank << 13);

		if (addr > rom_limit) {
			fatal_error("ROM overflow!");
			return;
		}

		/* copy the buffer */
		if (pass == LAST_PASS) {
			if (data) {
				memcpy(&rom[bank][loccnt], data, size);
				memset(&map[bank][loccnt], section + (page << 5), size);
			}
			else {
				memset(&rom[bank][loccnt], 0, size);
				memset(&map[bank][loccnt], section + (page << 5), size);
			}
		}
	}

	/* update the location counter */
	bank  += (loccnt + size) >> 13;
	loccnt = (loccnt + size) & 0x1FFF;

	/* update rom size */
	if (bank < RESERVED_BANK) {
		if (bank > max_bank) {
			if (loccnt)
				max_bank = bank;
			else
				max_bank = bank - 1;
		}
	}
}